

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_winzip_aes_decode.c
# Opt level: O0

zip_int64_t
winzip_aes_decrypt(zip_source_t *src,void *ud,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  _Bool _Var1;
  int iVar2;
  int local_5c;
  zip_stat_t *st;
  zip_int64_t n;
  winzip_aes *ctx;
  zip_uint64_t zStack_30;
  zip_source_cmd_t cmd_local;
  zip_uint64_t len_local;
  void *data_local;
  void *ud_local;
  zip_source_t *src_local;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    iVar2 = decrypt_header(src,(winzip_aes *)ud);
    if (iVar2 < 0) {
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      *(undefined8 *)((long)ud + 0x18) = 0;
      src_local = (zip_source_t *)0x0;
    }
    break;
  case ZIP_SOURCE_READ:
    zStack_30 = len;
    if ((ulong)(*(long *)((long)ud + 0x10) - *(long *)((long)ud + 0x18)) < len) {
      zStack_30 = *(long *)((long)ud + 0x10) - *(long *)((long)ud + 0x18);
    }
    if (zStack_30 == 0) {
      _Var1 = verify_hmac(src,(winzip_aes *)ud);
      if (_Var1) {
        src_local = (zip_source_t *)0x0;
      }
      else {
        src_local = (zip_source_t *)0xffffffffffffffff;
      }
    }
    else {
      src_local = (zip_source_t *)zip_source_read(src,data,zStack_30);
      if ((long)src_local < 0) {
        _zip_error_set_from_source((zip_error_t *)((long)ud + 0x28),src);
        src_local = (zip_source_t *)0xffffffffffffffff;
      }
      else {
        *(long *)((long)ud + 0x18) = (long)&src_local->src + *(long *)((long)ud + 0x18);
        _Var1 = _zip_winzip_aes_decrypt
                          (*(zip_winzip_aes_t **)((long)ud + 0x20),(zip_uint8_t *)data,
                           (zip_uint64_t)src_local);
        if (!_Var1) {
          zip_error_set((zip_error_t *)((long)ud + 0x28),0x14,0);
          src_local = (zip_source_t *)0xffffffffffffffff;
        }
      }
    }
    break;
  case ZIP_SOURCE_CLOSE:
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_STAT:
    *(undefined2 *)((long)data + 0x36) = 0;
    *(ulong *)data = *data | 0x80;
    if ((*data & 8) != 0) {
      if (*(short *)((long)ud + 8) == 0x101) {
        local_5c = 8;
      }
      else {
        local_5c = 0x10;
        if (*(short *)((long)ud + 8) == 0x102) {
          local_5c = 0xc;
        }
      }
      *(long *)((long)data + 0x20) = *(long *)((long)data + 0x20) - (long)(local_5c + 0xc);
    }
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_ERROR:
    src_local = (zip_source_t *)zip_error_to_data((zip_error_t *)((long)ud + 0x28),data,len);
    break;
  case ZIP_SOURCE_FREE:
    winzip_aes_free((winzip_aes *)ud);
    src_local = (zip_source_t *)0x0;
    break;
  default:
    zip_error_set((zip_error_t *)((long)ud + 0x28),0x12,0);
    src_local = (zip_source_t *)0xffffffffffffffff;
    break;
  case ZIP_SOURCE_SUPPORTS:
    src_local = (zip_source_t *)zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,3,4,5,0xffffffff)
    ;
  }
  return (zip_int64_t)src_local;
}

Assistant:

static zip_int64_t
winzip_aes_decrypt(zip_source_t *src, void *ud, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct winzip_aes *ctx;
    zip_int64_t n;

    ctx = (struct winzip_aes *)ud;

    switch (cmd) {
    case ZIP_SOURCE_OPEN:
	if (decrypt_header(src, ctx) < 0) {
	    return -1;
	}
	ctx->current_position = 0;
	return 0;

    case ZIP_SOURCE_READ:
	if (len > ctx->data_length - ctx->current_position) {
	    len = ctx->data_length - ctx->current_position;
	}

	if (len == 0) {
	    if (!verify_hmac(src, ctx)) {
		return -1;
	    }
	    return 0;
	}

	if ((n = zip_source_read(src, data, len)) < 0) {
	    _zip_error_set_from_source(&ctx->error, src);
	    return -1;
	}
	ctx->current_position += (zip_uint64_t)n;

	if (!_zip_winzip_aes_decrypt(ctx->aes_ctx, (zip_uint8_t *)data, (zip_uint64_t)n)) {
	    zip_error_set(&ctx->error, ZIP_ER_INTERNAL, 0);
	    return -1;
	}

	return n;

    case ZIP_SOURCE_CLOSE:
	return 0;

    case ZIP_SOURCE_STAT: {
	zip_stat_t *st;

	st = (zip_stat_t *)data;

	st->encryption_method = ZIP_EM_NONE;
	st->valid |= ZIP_STAT_ENCRYPTION_METHOD;
	if (st->valid & ZIP_STAT_COMP_SIZE) {
	    st->comp_size -= 12 + SALT_LENGTH(ctx->encryption_method);
	}

	return 0;
    }

    case ZIP_SOURCE_SUPPORTS:
	return zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, -1);

    case ZIP_SOURCE_ERROR:
	return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
	winzip_aes_free(ctx);
	return 0;

    default:
	zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	return -1;
    }
}